

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O3

string * __thiscall
t_netstd_generator::make_valid_csharp_identifier
          (string *__return_storage_ptr__,t_netstd_generator *this,string *fromName)

{
  byte bVar1;
  pointer pcVar2;
  ulong uVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (fromName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + fromName->_M_string_length);
  uVar3 = __return_storage_ptr__->_M_string_length;
  if (uVar3 != 0) {
    if ((byte)(*(__return_storage_ptr__->_M_dataplus)._M_p - 0x30U) < 10) {
      std::operator+(&local_40,"_",__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
      uVar3 = __return_storage_ptr__->_M_string_length;
      if (uVar3 == 0) {
        return __return_storage_ptr__;
      }
    }
    uVar4 = 0;
    do {
      bVar1 = (__return_storage_ptr__->_M_dataplus)._M_p[uVar4];
      if (((byte)((bVar1 & 0xdf) + 0xa5) < 0xe6) && (bVar1 != 0x5f && (byte)(bVar1 - 0x3a) < 0xf6))
      {
        std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar4,(char *)0x1,0x391c06);
        uVar3 = __return_storage_ptr__->_M_string_length;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_netstd_generator::make_valid_csharp_identifier(string const& fromName)
{
    string str = fromName;
    if (str.empty())
    {
        return str;
    }

    // tests rely on this
    assert(('A' < 'Z') && ('a' < 'z') && ('0' < '9'));

    // if the first letter is a number, we add an additional underscore in front of it
    char c = str.at(0);
    if (('0' <= c) && (c <= '9'))
    {
        str = "_" + str;
    }

    // following chars: letter, number or underscore
    for (size_t i = 0; i < str.size(); ++i)
    {
        c = str.at(i);
        if (('A' > c || c > 'Z') && ('a' > c || c > 'z') && ('0' > c || c > '9') && '_' != c)
        {
            str.replace(i, 1, "_");
        }
    }

    return str;
}